

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_setup(mbedtls_md_context_t *ctx,mbedtls_md_info_t *md_info,int hmac)

{
  void *pvVar1;
  int hmac_local;
  mbedtls_md_info_t *md_info_local;
  mbedtls_md_context_t *ctx_local;
  
  if ((md_info == (mbedtls_md_info_t *)0x0) || (ctx == (mbedtls_md_context_t *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    switch(md_info->type) {
    case MBEDTLS_MD_MD5:
      pvVar1 = calloc(1,0x58);
      ctx->md_ctx = pvVar1;
      if (ctx->md_ctx == (void *)0x0) {
        return -0x5180;
      }
      mbedtls_md5_init((mbedtls_md5_context *)ctx->md_ctx);
      break;
    case MBEDTLS_MD_SHA1:
      pvVar1 = calloc(1,0x5c);
      ctx->md_ctx = pvVar1;
      if (ctx->md_ctx == (void *)0x0) {
        return -0x5180;
      }
      mbedtls_sha1_init((mbedtls_sha1_context *)ctx->md_ctx);
      break;
    case MBEDTLS_MD_SHA224:
    case MBEDTLS_MD_SHA256:
      pvVar1 = calloc(1,0x6c);
      ctx->md_ctx = pvVar1;
      if (ctx->md_ctx == (void *)0x0) {
        return -0x5180;
      }
      mbedtls_sha256_init((mbedtls_sha256_context *)ctx->md_ctx);
      break;
    case MBEDTLS_MD_SHA384:
    case MBEDTLS_MD_SHA512:
      pvVar1 = calloc(1,0xd8);
      ctx->md_ctx = pvVar1;
      if (ctx->md_ctx == (void *)0x0) {
        return -0x5180;
      }
      mbedtls_sha512_init((mbedtls_sha512_context *)ctx->md_ctx);
      break;
    case MBEDTLS_MD_RIPEMD160:
      pvVar1 = calloc(1,0x5c);
      ctx->md_ctx = pvVar1;
      if (ctx->md_ctx == (void *)0x0) {
        return -0x5180;
      }
      mbedtls_ripemd160_init((mbedtls_ripemd160_context *)ctx->md_ctx);
      break;
    default:
      return -0x5100;
    }
    if (hmac != 0) {
      pvVar1 = calloc(2,(ulong)md_info->block_size);
      ctx->hmac_ctx = pvVar1;
      if (ctx->hmac_ctx == (void *)0x0) {
        mbedtls_md_free(ctx);
        return -0x5180;
      }
    }
    ctx->md_info = md_info;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_setup( mbedtls_md_context_t *ctx, const mbedtls_md_info_t *md_info, int hmac )
{
    if( md_info == NULL || ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    switch( md_info->type )
    {
#if defined(MBEDTLS_MD2_C)
        case MBEDTLS_MD_MD2:
            ALLOC( md2 );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case MBEDTLS_MD_MD4:
            ALLOC( md4 );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            ALLOC( md5 );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            ALLOC( ripemd160 );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            ALLOC( sha1 );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
        case MBEDTLS_MD_SHA256:
            ALLOC( sha256 );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case MBEDTLS_MD_SHA384:
#endif
        case MBEDTLS_MD_SHA512:
            ALLOC( sha512 );
            break;
#endif
        default:
            return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }

    if( hmac != 0 )
    {
        ctx->hmac_ctx = mbedtls_calloc( 2, md_info->block_size );
        if( ctx->hmac_ctx == NULL )
        {
            mbedtls_md_free( ctx );
            return( MBEDTLS_ERR_MD_ALLOC_FAILED );
        }
    }

    ctx->md_info = md_info;

    return( 0 );
}